

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void btreeEndTransaction(Btree *p)

{
  sqlite3 *psVar1;
  BtShared *pBVar2;
  MemPage *pMVar3;
  int iVar4;
  MemPage *pPage1;
  BtLock *pBVar5;
  BtLock *pBVar6;
  ushort uVar7;
  BtLock **ppBVar8;
  
  psVar1 = p->db;
  pBVar2 = p->pBt;
  pBVar2->bDoTruncate = '\0';
  if (p->inTrans == '\0') goto LAB_00128c6f;
  if (1 < psVar1->nVdbeRead) {
    if (pBVar2->pWriter == p) {
      pBVar2->pWriter = (Btree *)0x0;
      *(byte *)&pBVar2->btsFlags = (byte)pBVar2->btsFlags & 0x9f;
      for (pBVar6 = pBVar2->pLock; pBVar6 != (BtLock *)0x0; pBVar6 = pBVar6->pNext) {
        pBVar6->eLock = '\x01';
      }
    }
    p->inTrans = '\x01';
    return;
  }
  if (pBVar2->pLock != (BtLock *)0x0) {
    ppBVar8 = &pBVar2->pLock;
    pBVar6 = pBVar2->pLock;
    do {
      if (pBVar6->pBtree == p) {
        pBVar5 = pBVar6->pNext;
        *ppBVar8 = pBVar5;
        if (pBVar6->iTable != 1) {
          sqlite3_free(pBVar6);
          goto LAB_00128c08;
        }
      }
      else {
        ppBVar8 = &pBVar6->pNext;
LAB_00128c08:
        pBVar5 = *ppBVar8;
      }
      pBVar6 = pBVar5;
    } while (pBVar5 != (BtLock *)0x0);
  }
  if (pBVar2->pWriter == p) {
    pBVar2->pWriter = (Btree *)0x0;
    iVar4 = pBVar2->nTransaction;
    uVar7 = 0xff9f;
LAB_00128c5d:
    pBVar2->btsFlags = pBVar2->btsFlags & uVar7;
  }
  else {
    iVar4 = pBVar2->nTransaction;
    if (iVar4 == 2) {
      uVar7 = 0xffbf;
      iVar4 = 2;
      goto LAB_00128c5d;
    }
  }
  pBVar2->nTransaction = iVar4 + -1;
  if (iVar4 + -1 == 0) {
    pBVar2->inTransaction = '\0';
  }
LAB_00128c6f:
  p->inTrans = '\0';
  if ((pBVar2->inTransaction == '\0') && (pMVar3 = pBVar2->pPage1, pMVar3 != (MemPage *)0x0)) {
    pBVar2->pPage1 = (MemPage *)0x0;
    sqlite3PagerUnrefNotNull(pMVar3->pDbPage);
    return;
  }
  return;
}

Assistant:

static void btreeEndTransaction(Btree *p){
  BtShared *pBt = p->pBt;
  sqlite3 *db = p->db;
  assert( sqlite3BtreeHoldsMutex(p) );

#ifndef SQLITE_OMIT_AUTOVACUUM
  pBt->bDoTruncate = 0;
#endif
  if( p->inTrans>TRANS_NONE && db->nVdbeRead>1 ){
    /* If there are other active statements that belong to this database
    ** handle, downgrade to a read-only transaction. The other statements
    ** may still be reading from the database.  */
    downgradeAllSharedCacheTableLocks(p);
    p->inTrans = TRANS_READ;
  }else{
    /* If the handle had any kind of transaction open, decrement the 
    ** transaction count of the shared btree. If the transaction count 
    ** reaches 0, set the shared state to TRANS_NONE. The unlockBtreeIfUnused()
    ** call below will unlock the pager.  */
    if( p->inTrans!=TRANS_NONE ){
      clearAllSharedCacheTableLocks(p);
      pBt->nTransaction--;
      if( 0==pBt->nTransaction ){
        pBt->inTransaction = TRANS_NONE;
      }
    }

    /* Set the current transaction state to TRANS_NONE and unlock the 
    ** pager if this call closed the only read or write transaction.  */
    p->inTrans = TRANS_NONE;
    unlockBtreeIfUnused(pBt);
  }

  btreeIntegrity(p);
}